

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.cpp
# Opt level: O2

size_t duckdb_zstd::HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  int *piVar1;
  U32 s;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  size_t __n;
  size_t sVar7;
  
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  if (sourceSize == 0) {
    sVar7 = 0;
    switchD_016d4fed::default(count,0,__n);
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar6 = (byte *)(sourceSize + (long)source);
    switchD_016d4fed::default(workSpace,0,0x1000);
    uVar5 = *source;
    for (; (byte *)((long)source + 4) < pbVar6 + -0xf; source = (void *)((long)source + 0x10)) {
      uVar4 = *(uint *)((long)source + 4);
      workSpace[uVar5 & 0xff] = workSpace[uVar5 & 0xff] + 1;
      workSpace[(ulong)(uVar5 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar5 >> 8 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)workSpace + (ulong)(uVar5 >> 0xe & 0x3fc) + 0x800);
      *piVar1 = *piVar1 + 1;
      workSpace[(ulong)(uVar5 >> 0x18) + 0x300] = workSpace[(ulong)(uVar5 >> 0x18) + 0x300] + 1;
      uVar5 = *(uint *)((long)source + 8);
      workSpace[uVar4 & 0xff] = workSpace[uVar4 & 0xff] + 1;
      workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)workSpace + (ulong)(uVar4 >> 0xe & 0x3fc) + 0x800);
      *piVar1 = *piVar1 + 1;
      workSpace[(ulong)(uVar4 >> 0x18) + 0x300] = workSpace[(ulong)(uVar4 >> 0x18) + 0x300] + 1;
      uVar4 = *(uint *)((long)source + 0xc);
      workSpace[uVar5 & 0xff] = workSpace[uVar5 & 0xff] + 1;
      workSpace[(ulong)(uVar5 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar5 >> 8 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)workSpace + (ulong)(uVar5 >> 0xe & 0x3fc) + 0x800);
      *piVar1 = *piVar1 + 1;
      workSpace[(ulong)(uVar5 >> 0x18) + 0x300] = workSpace[(ulong)(uVar5 >> 0x18) + 0x300] + 1;
      uVar5 = *(uint *)((long)source + 0x10);
      workSpace[uVar4 & 0xff] = workSpace[uVar4 & 0xff] + 1;
      workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] =
           workSpace[(ulong)(uVar4 >> 8 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)workSpace + (ulong)(uVar4 >> 0xe & 0x3fc) + 0x800);
      *piVar1 = *piVar1 + 1;
      workSpace[(ulong)(uVar4 >> 0x18) + 0x300] = workSpace[(ulong)(uVar4 >> 0x18) + 0x300] + 1;
    }
    for (; source < pbVar6; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    uVar5 = 0;
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      uVar4 = workSpace[lVar2 + 0x200] + workSpace[lVar2 + 0x100] + workSpace[lVar2 + 0x300] +
              workSpace[lVar2];
      workSpace[lVar2] = uVar4;
      if (uVar5 < uVar4) {
        uVar5 = uVar4;
      }
    }
    uVar3 = 0x100;
    do {
      uVar4 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar4;
    } while (workSpace[uVar3] == 0);
    if ((check == trustInput) || (uVar4 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = uVar4;
      memmove(count,workSpace,__n);
      sVar7 = (size_t)uVar5;
    }
    else {
      sVar7 = 0xffffffffffffffd0;
    }
  }
  return sVar7;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}